

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O0

HighsStatus __thiscall Highs::returnFromHighs(Highs *this,HighsStatus highs_return_status)

{
  bool bVar1;
  HighsDebugStatus HVar2;
  HighsStatus in_ESI;
  HighsOptions *in_RDI;
  HighsLp *unaff_retaddr;
  HEkk *in_stack_00000008;
  bool lp_factor_row_compatible;
  bool dimensions_ok;
  bool retained_ekk_data_ok;
  bool consistent;
  HighsStatus return_status;
  HighsLogOptions *in_stack_00000188;
  HighsLp *in_stack_00000190;
  string *in_stack_00000198;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  uint expectedNumRow;
  Highs *in_stack_ffffffffffffffa0;
  HEkk *this_00;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined1 local_39 [5];
  HighsInt in_stack_ffffffffffffffcc;
  HighsTimer *in_stack_ffffffffffffffd0;
  HighsStatus local_10;
  
  forceHighsSolutionBasisSize(in_stack_ffffffffffffffa0);
  HVar2 = debugHighsBasisConsistent
                    (in_RDI,(HighsLp *)in_stack_ffffffffffffffa0,
                     (HighsBasis *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  local_10 = in_ESI;
  if (HVar2 == kLogicalError) {
    highsLogUser((HighsLogOptions *)&in_RDI[3].super_HighsOptionsStruct.simplex_dualize_strategy,
                 kError,"returnFromHighs: Supposed to be a HiGHS basis, but not consistent\n");
    local_10 = kError;
  }
  HVar2 = HEkk::debugRetainedDataOk(in_stack_00000008,unaff_retaddr);
  if (HVar2 == kLogicalError) {
    highsLogUser((HighsLogOptions *)&in_RDI[3].super_HighsOptionsStruct.simplex_dualize_strategy,
                 kError,"returnFromHighs: Retained Ekk data not OK\n");
    local_10 = kError;
  }
  if ((in_RDI[0x12].field_0x3fc & 1) == 0) {
    highsLogDev((HighsLogOptions *)&in_RDI[3].super_HighsOptionsStruct.simplex_dualize_strategy,
                kError,"Highs::returnFromHighs() called with called_return_from_run false\n");
  }
  bVar1 = HighsTimer::running((HighsTimer *)
                              CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                              (HighsInt)((ulong)in_RDI >> 0x20));
  if (bVar1) {
    HighsTimer::stop(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  }
  this_00 = (HEkk *)local_39;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_39 + 1),"returnFromHighs",(allocator *)this_00);
  bVar1 = lpDimensionsOk(in_stack_00000198,in_stack_00000190,in_stack_00000188);
  expectedNumRow = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff9c);
  std::__cxx11::string::~string((string *)(local_39 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_39);
  if ((expectedNumRow & 0x1000000) == 0) {
    highsLogDev((HighsLogOptions *)&in_RDI[3].super_HighsOptionsStruct.simplex_dualize_strategy,
                kError,"LP Dimension error in returnFromHighs()\n");
    local_10 = kError;
  }
  if (((in_RDI[0xe].super_HighsOptionsStruct.parallel.field_0x6 & 1) != 0) &&
     (bVar1 = HEkk::lpFactorRowCompatible(this_00,expectedNumRow), !bVar1)) {
    highsLogDev((HighsLogOptions *)&in_RDI[3].super_HighsOptionsStruct.simplex_dualize_strategy,
                kWarning,
                "Highs::returnFromHighs(): LP and HFactor have inconsistent numbers of rows\n");
    HEkk::clear(this_00);
  }
  return local_10;
}

Assistant:

HighsStatus Highs::returnFromHighs(HighsStatus highs_return_status) {
  // Applies checks before returning from HiGHS
  HighsStatus return_status = highs_return_status;

  forceHighsSolutionBasisSize();

  const bool consistent =
      debugHighsBasisConsistent(options_, model_.lp_, basis_) !=
      HighsDebugStatus::kLogicalError;
  if (!consistent) {
    highsLogUser(
        options_.log_options, HighsLogType::kError,
        "returnFromHighs: Supposed to be a HiGHS basis, but not consistent\n");
    assert(consistent);
    return_status = HighsStatus::kError;
  }
  // Check that any retained Ekk data - basis and NLA - are OK
  bool retained_ekk_data_ok = ekk_instance_.debugRetainedDataOk(model_.lp_) !=
                              HighsDebugStatus::kLogicalError;
  if (!retained_ekk_data_ok) {
    highsLogUser(options_.log_options, HighsLogType::kError,
                 "returnFromHighs: Retained Ekk data not OK\n");
    assert(retained_ekk_data_ok);
    return_status = HighsStatus::kError;
  }
  // Check that returnFromRun() has been called
  if (!called_return_from_run) {
    highsLogDev(
        options_.log_options, HighsLogType::kError,
        "Highs::returnFromHighs() called with called_return_from_run false\n");
    assert(called_return_from_run);
  }
  // Stop the HiGHS run clock if it is running
  if (timer_.running()) timer_.stop();
  const bool dimensions_ok =
      lpDimensionsOk("returnFromHighs", model_.lp_, options_.log_options);
  if (!dimensions_ok) {
    highsLogDev(options_.log_options, HighsLogType::kError,
                "LP Dimension error in returnFromHighs()\n");
    return_status = HighsStatus::kError;
  }
  assert(dimensions_ok);
  if (ekk_instance_.status_.has_nla) {
    const bool lp_factor_row_compatible =
        ekk_instance_.lpFactorRowCompatible(model_.lp_.num_row_);
    if (!lp_factor_row_compatible) {
      highsLogDev(options_.log_options, HighsLogType::kWarning,
                  "Highs::returnFromHighs(): LP and HFactor have inconsistent "
                  "numbers of rows\n");
      assert(lp_factor_row_compatible);
      // Clear Ekk entirely
      ekk_instance_.clear();
    }
  }
  return return_status;
}